

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O0

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info,string *command_name,
                         vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *objects_info,bool check_members,bool check_pnext,
                         XrShareSpacesRecipientBaseHeaderMETA *value)

{
  bool bVar1;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_c0;
  allocator local_a1;
  string local_a0 [55];
  allocator local_69;
  string local_68 [8];
  string error_str;
  XrShareSpacesRecipientGroupsMETA *new_value;
  XrResult xr_result;
  XrShareSpacesRecipientBaseHeaderMETA *value_local;
  bool check_pnext_local;
  bool check_members_local;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *objects_info_local;
  string *command_name_local;
  GenValidUsageXrInstanceInfo *instance_info_local;
  
  if (value->type == XR_TYPE_SHARE_SPACES_RECIPIENT_GROUPS_META) {
    if ((instance_info != (GenValidUsageXrInstanceInfo *)0x0) &&
       (bVar1 = ExtensionEnabled(&instance_info->enabled_extensions,
                                 "XR_META_spatial_entity_group_sharing"), !bVar1)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_68,"XrShareSpacesRecipientBaseHeaderMETA being used with child struct type ",
                 &local_69);
      std::allocator<char>::~allocator((allocator<char> *)&local_69);
      std::__cxx11::string::operator+=(local_68,"\"XR_TYPE_SHARE_SPACES_RECIPIENT_GROUPS_META\"");
      std::__cxx11::string::operator+=
                (local_68,
                 " which requires extension \"XR_META_spatial_entity_group_sharing\" to be enabled, but it is not enabled"
                );
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_a0,"VUID-XrShareSpacesRecipientBaseHeaderMETA-type-type",&local_a1);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                (&local_c0,objects_info);
      CoreValidLogMessage(instance_info,(string *)local_a0,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                          command_name,&local_c0,(string *)local_68);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                (&local_c0);
      std::__cxx11::string::~string(local_a0);
      std::allocator<char>::~allocator((allocator<char> *)&local_a1);
      std::__cxx11::string::~string(local_68);
      return XR_ERROR_VALIDATION_FAILURE;
    }
    instance_info_local._4_4_ =
         ValidateXrStruct(instance_info,command_name,objects_info,check_members,false,
                          (XrShareSpacesRecipientGroupsMETA *)value);
  }
  else {
    InvalidStructureType
              (instance_info,command_name,objects_info,"XrShareSpacesRecipientBaseHeaderMETA",
               value->type,"VUID-XrShareSpacesRecipientBaseHeaderMETA-type-type",XR_TYPE_UNKNOWN,"")
    ;
    instance_info_local._4_4_ = XR_ERROR_VALIDATION_FAILURE;
  }
  return instance_info_local._4_4_;
}

Assistant:

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info, const std::string &command_name,
                          std::vector<GenValidUsageXrObjectInfo>& objects_info, bool check_members, bool check_pnext,
                          const XrShareSpacesRecipientBaseHeaderMETA* value) {
    XrResult xr_result = XR_SUCCESS;
    (void)xr_result;
    (void)instance_info;
    (void)command_name;
    (void)objects_info;
    (void)check_members;
    (void)value;
    // NOTE: Can't validate "VUID-XrShareSpacesRecipientBaseHeaderMETA-type-parameter" because it is a base structure
    // NOTE: Can't validate "VUID-XrShareSpacesRecipientBaseHeaderMETA-next-next" because it is a base structure
    if (value->type == XR_TYPE_SHARE_SPACES_RECIPIENT_GROUPS_META) {
        const XrShareSpacesRecipientGroupsMETA* new_value = reinterpret_cast<const XrShareSpacesRecipientGroupsMETA*>(value);
        if (nullptr != instance_info && !ExtensionEnabled(instance_info->enabled_extensions, "XR_META_spatial_entity_group_sharing")) {
            std::string error_str = "XrShareSpacesRecipientBaseHeaderMETA being used with child struct type ";
            error_str += "\"XR_TYPE_SHARE_SPACES_RECIPIENT_GROUPS_META\"";
            error_str += " which requires extension \"XR_META_spatial_entity_group_sharing\" to be enabled, but it is not enabled";
            CoreValidLogMessage(instance_info, "VUID-XrShareSpacesRecipientBaseHeaderMETA-type-type",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info, error_str);
            return XR_ERROR_VALIDATION_FAILURE;
        }
        return ValidateXrStruct(instance_info, command_name, objects_info, check_members, false, new_value);
    }
    InvalidStructureType(instance_info, command_name, objects_info, "XrShareSpacesRecipientBaseHeaderMETA",
                         value->type, "VUID-XrShareSpacesRecipientBaseHeaderMETA-type-type");
    return XR_ERROR_VALIDATION_FAILURE;
}